

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

ArrayInfo * GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(gguf_context *ctx,int k)

{
  runtime_error *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int in_EDX;
  undefined8 in_RSI;
  ArrayInfo *in_RDI;
  gguf_type kt;
  undefined8 in_stack_ffffffffffffffa8;
  int k_00;
  ArrayInfo *ctx_00;
  string local_30 [32];
  int local_10;
  int local_c;
  undefined8 local_8;
  
  k_00 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  ctx_00 = in_RDI;
  local_c = in_EDX;
  local_8 = in_RSI;
  local_10 = gguf_get_kv_type(in_RSI,(long)in_EDX);
  if (local_10 != 9) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar1 = gguf_get_key(local_8,(long)local_c);
    uVar2 = gguf_type_name(local_10);
    uVar3 = gguf_type_name(9);
    format_abi_cxx11_((char *)local_30,"key %s has wrong type %s but expected type %s",uVar1,uVar2,
                      uVar3);
    std::runtime_error::runtime_error(this,local_30);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  GKV_Base<GGUFMeta::ArrayInfo>::getter((gguf_context *)ctx_00,k_00);
  return in_RDI;
}

Assistant:

static T get_kv(const gguf_context * ctx, const int k) {
            const enum gguf_type kt = gguf_get_kv_type(ctx, k);

            if (kt != GKV::gt) {
                throw std::runtime_error(format("key %s has wrong type %s but expected type %s",
                    gguf_get_key(ctx, k), gguf_type_name(kt), gguf_type_name(GKV::gt)));
            }
            return GKV::getter(ctx, k);
        }